

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&this->b);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                     *)this);
  return;
}

Assistant:

~QStringBuilder() = default;